

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O2

void __thiscall
OSTEI_HRR_Writer::WriteBraSteps_
          (OSTEI_HRR_Writer *this,ostream *os,HRRDoubletStepList *steps,string *tag,
          string *ncart_ket,string *ketstr)

{
  pointer pHVar1;
  ostream *poVar2;
  OSTEI_HRR_Writer *pOVar3;
  char *pcVar4;
  pointer pHVar5;
  OSTEI_HRR_Writer local_110;
  Doublet src1;
  Doublet src0;
  Doublet target;
  
  poVar2 = std::operator<<(os,(string *)&indent4_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"for(iket = 0; iket < ");
  poVar2 = std::operator<<(poVar2,(string *)ncart_ket);
  std::operator<<(poVar2,"; ++iket)\n");
  poVar2 = std::operator<<(os,(string *)&indent4_abi_cxx11_);
  std::operator<<(poVar2,"{\n");
  pHVar1 = (steps->super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pHVar5 = (steps->super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>)._M_impl
                .super__Vector_impl_data._M_start; pHVar5 != pHVar1; pHVar5 = pHVar5 + 1) {
    Doublet::Doublet(&target,&pHVar5->target);
    Doublet::Doublet(&src0,(pHVar5->src)._M_elems);
    Doublet::Doublet(&src1,(pHVar5->src)._M_elems + 1);
    std::__cxx11::string::_M_assign((string *)&target.tag);
    std::__cxx11::string::_M_assign((string *)&src0.tag);
    std::__cxx11::string::_M_assign((string *)&src1.tag);
    pcVar4 = " + ";
    if (pHVar5->type == I) {
      pcVar4 = " - ";
    }
    local_110._vptr_OSTEI_HRR_Writer = (_func_int **)&local_110.info_;
    std::__cxx11::string::_M_construct((ulong)&local_110,'\x14');
    pOVar3 = &local_110;
    std::operator<<(os,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    HRRBraStepVar_((string *)&local_110,pOVar3,&target,ncart_ket,ketstr);
    std::operator<<(os,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    pOVar3 = (OSTEI_HRR_Writer *)0x13abe1;
    std::operator<<(os," = ");
    HRRBraStepVar_((string *)&local_110,pOVar3,&src0,ncart_ket,ketstr);
    std::operator<<(os,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    poVar2 = std::operator<<(os,pcVar4);
    poVar2 = std::operator<<(poVar2,"( hAB[");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,pHVar5->xyz);
    pOVar3 = (OSTEI_HRR_Writer *)0x13c969;
    std::operator<<(poVar2,"] * ");
    HRRBraStepVar_((string *)&local_110,pOVar3,&src1,ncart_ket,ketstr);
    std::operator<<(os,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::operator<<(os," );");
    std::operator<<(os,"\n\n");
    std::__cxx11::string::~string((string *)&src1.tag);
    std::__cxx11::string::~string((string *)&src0.tag);
    std::__cxx11::string::~string((string *)&target.tag);
  }
  poVar2 = std::operator<<(os,(string *)&indent4_abi_cxx11_);
  std::operator<<(poVar2,"}\n");
  std::operator<<(os,"\n");
  return;
}

Assistant:

void OSTEI_HRR_Writer::WriteBraSteps_(std::ostream & os, const HRRDoubletStepList & steps,
                                      const std::string & tag,
                                      const std::string & ncart_ket, const std::string & ketstr) const
{
    os << indent4 << "for(iket = 0; iket < " << ncart_ket << "; ++iket)\n";
    os << indent4 << "{\n";

    for(const auto & it : steps)
    {
        //os << std::string(20, ' ') << "// " << it << "\n";

        // add the appropriate integral tags
        Doublet target(it.target);
        Doublet src0(it.src[0]);
        Doublet src1(it.src[1]);
        target.tag = tag;
        src0.tag = tag;
        src1.tag = tag;
    
        const char * sign = " + ";
        if(it.type == RRStepType::I) // moving from J->I
            sign = " - ";

        os << std::string(20, ' ');

        os << HRRBraStepVar_(target, ncart_ket, ketstr);

        os << " = ";
        os << HRRBraStepVar_(src0, ncart_ket, ketstr);
        os << sign << "( hAB[" << static_cast<int>(it.xyz) << "] * ";
        os << HRRBraStepVar_(src1, ncart_ket, ketstr);
        os << " );";
        os << "\n\n";
    }

    os << indent4 << "}\n";
    os << "\n";
}